

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

void __thiscall cursespp::App::FocusNextInLayout(App *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  WindowState *pWVar3;
  App *pAVar4;
  IWindowPtr local_20;
  
  pWVar3 = &this->state;
  if ((this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    pWVar3 = (WindowState *)&(this->state).layout;
  }
  peVar1 = (pWVar3->overlay).super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (pWVar3->overlay).super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (peVar1 != (element_type *)0x0) {
    pAVar4 = (App *)&(this->injectedKeys).c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first;
    if ((this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      pAVar4 = this;
    }
    peVar1 = (pAVar4->state).overlay.
             super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (pAVar4->state).overlay.
             super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*(peVar1->super_IWindowGroup)._vptr_IWindowGroup[8])(&local_20);
    UpdateFocusedWindow(this,&local_20);
    if (local_20.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  return;
}

Assistant:

void App::FocusNextInLayout() {
    if (!this->state.ActiveLayout()) {
        return;
    }

    this->UpdateFocusedWindow(this->state.ActiveLayout()->FocusNext());
}